

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O3

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int>::update_DA
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int> *this,sa_leaf L1,sa_leaf L2,
          bool compute_lcp,uint64_t *lcp_values,uint64_t *m)

{
  ulong uVar1;
  ulong *puVar2;
  pointer puVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t i;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  uVar6 = L2.rn.first + L1.rn.first;
  uVar7 = L1.rn.second + L2.rn.first;
  uVar1 = L2.rn.second + L1.rn.second;
  if (uVar6 < uVar7) {
    lVar9 = (long)(this->DA).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar10 = L1.rn.second - L1.rn.first;
    uVar5 = uVar6;
    do {
      uVar8 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar8 = uVar5;
      }
      bVar4 = (byte)uVar5 & 0x3f;
      puVar2 = (ulong *)(((long)uVar8 >> 6) * 8 + lVar9 + -8 +
                        (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      *m = *m + 1;
      uVar5 = uVar5 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  if (uVar7 < uVar1) {
    lVar9 = (long)(this->DA).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar10 = L2.rn.second - L2.rn.first;
    do {
      uVar5 = uVar7 + 0x3f;
      if (-1 < (long)uVar7) {
        uVar5 = uVar7;
      }
      puVar2 = (ulong *)(lVar9 + ((long)uVar5 >> 6) * 8 + -8 +
                        (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
      *m = *m + 1;
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  auVar12 = _DAT_0011d0d0;
  auVar15 = _DAT_0011d0c0;
  if ((compute_lcp) && (uVar6 + 1 < uVar1)) {
    puVar3 = (this->LCP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (uVar1 + ~L2.rn.first) - L1.rn.first;
    lVar10 = lVar9 + -1;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *lcp_values;
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_0011d0d0;
    do {
      auVar18 = auVar17;
      auVar13._8_4_ = (int)uVar6;
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = (int)(uVar6 >> 0x20);
      auVar17 = (auVar13 | auVar15) ^ auVar12;
      auVar16._0_4_ = -(uint)(auVar11._0_4_ < auVar17._0_4_);
      auVar16._4_4_ = -(uint)(auVar11._4_4_ < auVar17._4_4_);
      auVar16._8_4_ = -(uint)(auVar11._8_4_ < auVar17._8_4_);
      auVar16._12_4_ = -(uint)(auVar11._12_4_ < auVar17._12_4_);
      auVar14._4_4_ = -(uint)(auVar17._4_4_ == auVar11._4_4_);
      auVar14._12_4_ = -(uint)(auVar17._12_4_ == auVar11._12_4_);
      auVar14._0_4_ = auVar14._4_4_;
      auVar14._8_4_ = auVar14._12_4_;
      auVar19._4_4_ = auVar16._4_4_;
      auVar19._0_4_ = auVar16._4_4_;
      auVar19._8_4_ = auVar16._12_4_;
      auVar19._12_4_ = auVar16._12_4_;
      auVar19 = auVar14 & auVar16 | auVar19;
      if ((~auVar19._0_4_ & 1) != 0) {
        puVar3[L2.rn.first + L1.rn.first + uVar6 + 1] = (uint)L1.depth;
      }
      if (((auVar19._8_2_ ^ 0xffff) & 1) != 0) {
        puVar3[L2.rn.first + L1.rn.first + uVar6 + 2] = (uint)L1.depth;
      }
      auVar17._0_8_ = auVar18._0_8_ + 1;
      auVar17._8_8_ = auVar18._8_8_ + 1;
      uVar6 = uVar6 + 2;
    } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar6);
    auVar12._4_4_ = auVar16._0_4_;
    auVar12._0_4_ = auVar16._0_4_;
    auVar12._8_4_ = auVar16._8_4_;
    auVar12._12_4_ = auVar16._8_4_;
    auVar15._4_4_ = auVar16._4_4_;
    auVar15._0_4_ = auVar16._4_4_;
    auVar15._8_4_ = auVar16._12_4_;
    auVar15._12_4_ = auVar16._12_4_;
    auVar15 = auVar14 & auVar12 | auVar15;
    auVar15 = ~auVar15 & auVar17 | auVar18 & auVar15;
    *lcp_values = auVar15._8_8_ + auVar15._0_8_;
  }
  return;
}

Assistant:

void update_DA(sa_leaf L1,sa_leaf L2, bool compute_lcp, uint64_t & lcp_values, uint64_t & m){

		uint64_t start1 = L1.rn.first + L2.rn.first;//start position of first interval in merged intervals
		uint64_t start2 = L2.rn.first + L1.rn.second;//start position of second interval in merged intervals
		uint64_t end = L1.rn.second + L2.rn.second;//end position (excluded) of merged intervals

		assert(end>start1);

		for(uint64_t i = start1; i<start2; ++i){
			DA[i] = 0;
			m++;
		}

		for(uint64_t i = start2; i<end; ++i){
			DA[i] = 1;
			m++;
		}

		assert(L1.depth==L2.depth);

		if(compute_lcp){

			for(uint64_t i = start1+1; i<end; ++i){

				assert(LCP[i]==nil);

				LCP[i] = L1.depth;

				lcp_values++;

			}

		}

		assert(m<=n);

	}